

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O2

uint solver_clause_create(solver_t *s,vec_uint_t *lits,uint f_learnt)

{
  long *plVar1;
  uint value;
  uint uVar2;
  uint *puVar3;
  clause_conflict *clause;
  
  if (lits->size < 2) {
    __assert_fail("vec_uint_size(lits) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                  ,0x1e9,"unsigned int solver_clause_create(solver_t *, vec_uint_t *, unsigned int)"
                 );
  }
  if (f_learnt < 2) {
    value = cdb_append(s->all_clauses,f_learnt + lits->size + 3);
    if (value == 0xffffffff) {
      clause = (clause_conflict *)0x0;
    }
    else {
      clause = (clause_conflict *)(s->all_clauses->data + value);
    }
    *(uint *)clause = (*(uint *)clause & 0xfffffff0) + f_learnt * 8 | f_learnt;
    clause->size = lits->size;
    puVar3 = vec_uint_data(lits);
    memcpy(clause + 1,puVar3,(ulong)lits->size << 2);
    if (f_learnt == 0) {
      vec_uint_push_back(s->originals,value);
      plVar1 = &(s->stats).n_original_lits;
      *plVar1 = *plVar1 + (ulong)lits->size;
    }
    else {
      vec_uint_push_back(s->learnts,value);
      puVar3 = vec_uint_data(lits);
      uVar2 = clause_clac_lbd(s,puVar3,lits->size);
      *(uint *)clause = *(uint *)clause & 0xf | uVar2 << 4;
      *(undefined4 *)(&clause[1].field_0x0 + (ulong)clause->size * 4) = 0;
      plVar1 = &(s->stats).n_learnt_lits;
      *plVar1 = *plVar1 + (ulong)lits->size;
      clause_act_bump(s,clause);
    }
    return value;
  }
  __assert_fail("f_learnt == 0 || f_learnt == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                ,0x1ea,"unsigned int solver_clause_create(solver_t *, vec_uint_t *, unsigned int)");
}

Assistant:

unsigned solver_clause_create(solver_t *s, vec_uint_t *lits, unsigned f_learnt)
{
    struct clause *clause;
    unsigned cref;
    unsigned n_words;

    assert(vec_uint_size(lits) > 1);
    assert(f_learnt == 0 || f_learnt == 1);

    n_words = 3 + f_learnt + vec_uint_size(lits);
    cref = cdb_append(s->all_clauses, n_words);
    clause = clause_fetch(s, cref);
    clause->f_learnt = f_learnt;
    clause->f_mark = 0;
    clause->f_reallocd = 0;
    clause->f_deletable = f_learnt;
    clause->size = vec_uint_size(lits);
    memcpy(&(clause->data[0].lit), vec_uint_data(lits), sizeof(unsigned) * vec_uint_size(lits));

    if (f_learnt) {
        vec_uint_push_back(s->learnts, cref);
        clause->lbd = clause_clac_lbd(s, vec_uint_data(lits), vec_uint_size(lits));
        clause->data[clause->size].act = 0;
        s->stats.n_learnt_lits += vec_uint_size(lits);
        clause_act_bump(s, clause);
    } else {
        vec_uint_push_back(s->originals, cref);
        s->stats.n_original_lits += vec_uint_size(lits);
    }
    return cref;
}